

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

string * __thiscall Patch::get_json_abi_cxx11_(string *__return_storage_ptr__,Patch *this)

{
  Node *this_00;
  Point local_1bc [2];
  Point local_1a8;
  stringstream local_1a0 [8];
  stringstream result;
  Patch *this_local;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  if (this->root != (Node *)0x0) {
    this_00 = this->root;
    Point::Point(&local_1a8);
    Point::Point(local_1bc);
    Node::write_json(this_00,(stringstream *)local_1a0,local_1a8,local_1bc[0]);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Patch::get_json() const {
  std::stringstream result;
  if (root) root->write_json(result, Point(), Point());
  return result.str();
}